

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O0

void __thiscall
JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>::
MRURetentionPolicy(MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler> *this,
                  Recycler *allocator)

{
  Recycler *pRVar1;
  CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this_00;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *allocator_local;
  MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler> *this_local;
  
  local_18 = allocator;
  allocator_local = (Recycler *)this;
  Memory::
  WriteBarrierPtr<JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>_>
  ::WriteBarrierPtr(&this->store);
  pRVar1 = local_18;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)
             &CircularBuffer<Js::EvalMapStringInternal<false>,15u,Memory::Recycler>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Cache.h"
             ,0x66);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_40);
  this_00 = (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *)
            new<Memory::Recycler>(0x260,pRVar1,0x446fd0);
  CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::CircularBuffer(this_00);
  Memory::
  WriteBarrierPtr<JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>_>
  ::operator=(&this->store,this_00);
  return;
}

Assistant:

MRURetentionPolicy(TAllocator* allocator)
        {
            store = AllocatorNew(TAllocator, allocator, TMRUStoreType);
        }